

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void * rw::imageClose(void *object,int32 offset,int32 size)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = engine;
  lVar3 = (long)imageModuleOffset;
  lVar1 = engine + lVar3;
  (*DAT_00149850)(*(undefined8 *)(engine + lVar3));
  *(undefined8 *)(lVar4 + lVar3) = 0;
  *(undefined4 *)(lVar4 + 8 + lVar3) = 0;
  if (0 < *(int *)(lVar4 + 0x100 + lVar3)) {
    puVar2 = (undefined8 *)(lVar1 + 0x10);
    lVar4 = 0;
    do {
      (*DAT_00149850)(*puVar2);
      lVar4 = lVar4 + 1;
      puVar2 = puVar2 + 3;
    } while (lVar4 < *(int *)(lVar1 + 0x100));
  }
  *(undefined4 *)(lVar1 + 0x100) = 0;
  return object;
}

Assistant:

static void*
imageClose(void *object, int32 offset, int32 size)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	int i;
	rwFree(g->searchPaths);
	g->searchPaths = nil;
	g->numSearchPaths = 0;
	for(i = 0; i < g->numFileFormats; i++)
		rwFree(g->fileFormats[i].extension);
	g->numFileFormats = 0;
	return object;
}